

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>::
insert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,capnp::Text::Reader&>
          (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> table,size_t pos,
          Reader *params)

{
  long lVar1;
  int iVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  undefined8 *in_R9;
  ulong uVar4;
  ulong uVar5;
  Maybe<unsigned_long> MVar6;
  Iterator iter;
  Iterator local_70;
  size_t local_58;
  size_t local_50;
  SearchKey local_48;
  Entry *local_40;
  size_t *local_38;
  
  local_58 = table.size_;
  local_40 = table.ptr;
  local_38 = &local_58;
  local_48._vptr_SearchKey = (_func_int **)&PTR_search_001ca028;
  local_50 = pos;
  _::BTreeImpl::insert
            (&local_70,(BTreeImpl *)&(local_40->key).super_StringPtr.content.size_,&local_48);
  uVar4 = (ulong)local_70.row;
  if ((uVar4 != 0xe) && ((local_70.leaf)->rows[uVar4].i != 0)) {
    uVar5 = (ulong)((local_70.leaf)->rows[uVar4].i - 1);
    lVar1 = *(long *)(local_58 + 8 + uVar5 * 0x18);
    if (lVar1 == in_R9[1]) {
      iVar2 = bcmp(*(void **)(local_58 + uVar5 * 0x18),(void *)*in_R9,lVar1 - 1);
      if (iVar2 == 0) {
        *this = (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>)0x1;
        *(ulong *)(this + 8) = uVar5;
        aVar3 = extraout_RDX;
        goto LAB_00167d4e;
      }
    }
  }
  memmove((local_70.leaf)->rows + uVar4 + 1,(local_70.leaf)->rows + uVar4,
          (ulong)(local_70.row + 1) * -4 + 0x38);
  (local_70.leaf)->rows[uVar4].i = (int)params + 1;
  *this = (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>)0x0;
  aVar3 = extraout_RDX_00;
LAB_00167d4e:
  MVar6.ptr.field_1.value = aVar3.value;
  MVar6.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar6.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return nullptr;
    }
  }